

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O1

FldInfo * __thiscall
Memory::AllocateArray<Memory::Recycler,Js::FldInfo,false>
          (Memory *this,Recycler *allocator,offset_in_Recycler_to_subr AllocFunc,size_t count)

{
  FldInfo *pFVar1;
  ulong uVar2;
  
  if (count == 0) {
    Recycler::ClearTrackAllocInfo((Recycler *)this,(TrackAllocData *)0x0);
    pFVar1 = (FldInfo *)&DAT_00000008;
  }
  else {
    uVar2 = 0;
    pFVar1 = (FldInfo *)
             new__<Memory::Recycler>
                       (-(ulong)(count >> 0x3e != 0) | count << 2,(Recycler *)this,
                        (offset_in_Recycler_to_subr)allocator);
    do {
      ValueType::ValueType((ValueType *)((long)&(pFVar1->valueType).field_0 + uVar2));
      uVar2 = uVar2 + 4;
    } while (count << 2 != uVar2);
  }
  return pFVar1;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}